

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O0

int Granulator::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  float *pfVar1;
  bool bVar2;
  int iVar3;
  EffectData *pEVar4;
  float fVar5;
  float x;
  float fVar6;
  float local_ac;
  int local_a4;
  GranulatorSample *local_a0;
  float local_8c;
  int local_88;
  float s;
  int i;
  float f;
  int n;
  float prev;
  float invscale;
  float scale;
  float *src;
  int delaypos;
  int channel;
  GranulatorSample *gs;
  MutexScopeLock mutexScope;
  int usesample;
  EffectData *data;
  int numsamples_local;
  float *buffer_local;
  char *name_local;
  UnityAudioEffectState *state_local;
  
  pEVar4 = UnityAudioEffectState::GetEffectData<Granulator::EffectData>(state);
  iVar3 = strncmp(name,"Waveform",8);
  if (iVar3 == 0) {
    mutexScope.mutex._4_4_ = (int)pEVar4->p[0xc];
    MutexScopeLock::MutexScopeLock
              ((MutexScopeLock *)&gs,(Mutex *)sampleMutex,-1 < mutexScope.mutex._4_4_);
    if (mutexScope.mutex._4_4_ < 0) {
      local_a0 = &pEVar4->delay;
    }
    else {
      local_a0 = GetGranulatorSample(mutexScope.mutex._4_4_);
    }
    if ((local_a0->numsamples == 0) || (local_a0->numchannels == 0)) {
      memset(buffer,0,(long)numsamples << 2);
      state_local._4_4_ = 0;
      bVar2 = true;
    }
    else {
      src._4_4_ = name[8] + -0x30;
      if (local_a0->numchannels <= src._4_4_) {
        src._4_4_ = local_a0->numchannels + -1;
      }
      if (mutexScope.mutex._4_4_ < 0) {
        local_a4 = pEVar4->delaypos;
      }
      else {
        local_a4 = 0;
      }
      pfVar1 = local_a0->preview;
      fVar5 = (float)(local_a0->numsamples + -2) / (float)numsamples;
      f = 0.0;
      for (i = 0; i < numsamples; i = i + 1) {
        x = (float)i * fVar5;
        local_88 = FastFloor(x);
        fVar6 = (float)local_88;
        if (local_a0 == &pEVar4->delay) {
          local_88 = local_a4 + local_88;
        }
        local_8c = 0.0;
        if ((mutexScope.mutex._4_4_ < 0) && (local_a0->numsamples <= local_88)) {
          local_88 = local_88 - local_a0->numsamples;
        }
        if (local_88 < local_a0->numsamples) {
          iVar3 = local_88 + 1;
          local_8c = pfVar1[(long)src._4_4_ + (long)(local_a0->numchannels * local_88)];
          local_88 = iVar3;
          if ((mutexScope.mutex._4_4_ < 0) && (local_a0->numsamples <= iVar3)) {
            local_88 = iVar3 - local_a0->numsamples;
          }
          if (local_88 < local_a0->numsamples) {
            local_8c = (pfVar1[(long)src._4_4_ + (long)(local_a0->numchannels * local_88)] -
                       local_8c) * (x - fVar6) + local_8c;
          }
        }
        if (i == 0) {
          local_ac = 0.0;
        }
        else {
          local_ac = (local_8c - f) * (1.0 / fVar5);
        }
        buffer[i] = local_ac;
        f = local_8c;
      }
      bVar2 = false;
    }
    MutexScopeLock::~MutexScopeLock((MutexScopeLock *)&gs);
    if (bVar2) {
      return state_local._4_4_;
    }
  }
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (strncmp(name, "Waveform", 8) == 0)
        {
            int usesample = (int)data->p[P_USESAMPLE];
            MutexScopeLock mutexScope(Granulator::sampleMutex, usesample >= 0);
            GranulatorSample* gs = (usesample >= 0) ? &GetGranulatorSample(usesample) : &data->delay;
            if (gs->numsamples == 0 || gs->numchannels == 0)
            {
                memset(buffer, 0, sizeof(float) * numsamples);
                return UNITY_AUDIODSP_OK;
            }
            int channel = name[8] - '0';
            if (channel >= gs->numchannels)
                channel = gs->numchannels - 1;
            int delaypos = (usesample >= 0) ? 0 : data->delaypos;
            const float* src = gs->preview + channel;
            float scale = (float)(gs->numsamples - 2) / (float)numsamples;
            float invscale = 1.0f / scale, prev = 0.0f;
            for (int n = 0; n < numsamples; n++)
            {
                float f = n * scale;
                int i = FastFloor(f);
                f -= i;
                if (gs == &data->delay)
                    i += delaypos;
                float s = 0.0f;
                if (usesample < 0 && i >= gs->numsamples)
                    i -= gs->numsamples;
                if (i < gs->numsamples)
                {
                    s = src[gs->numchannels * i++];
                    if (usesample < 0 && i >= gs->numsamples)
                        i -= gs->numsamples;
                    if (i < gs->numsamples)
                        s += (src[gs->numchannels * i] - s) * f;
                }
                buffer[n] = (n == 0) ? 0.0f : (s - prev) * invscale;
                prev = s;
            }
        }
        return UNITY_AUDIODSP_OK;
    }